

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_inflatev(ucvector *out,uchar *in,size_t insize,LodePNGDecompressSettings *settings)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  size_t *in_RCX;
  uchar *in_RDX;
  ucvector *in_RSI;
  uint BTYPE;
  uint error;
  size_t pos;
  uint BFINAL;
  size_t bp;
  size_t in_stack_00000040;
  size_t *in_stack_00000048;
  size_t *in_stack_00000050;
  uchar *in_stack_00000058;
  ucvector *in_stack_00000060;
  uint local_44;
  undefined4 in_stack_ffffffffffffffc8;
  uint uVar4;
  size_t *pos_00;
  
  pos_00 = (size_t *)0x0;
  uVar4 = 0;
  local_44 = 0;
  do {
    if (uVar4 != 0) {
      return local_44;
    }
    if ((ulong)((long)in_RDX << 3) <= (long)pos_00 + 2U) {
      return 0x34;
    }
    bVar1 = readBitFromStream((size_t *)&stack0xffffffffffffffd0,(uchar *)in_RSI);
    uVar4 = (uint)bVar1;
    bVar1 = readBitFromStream((size_t *)&stack0xffffffffffffffd0,(uchar *)in_RSI);
    bVar2 = readBitFromStream((size_t *)&stack0xffffffffffffffd0,(uchar *)in_RSI);
    iVar3 = (uint)bVar2 * 2 + (uint)bVar1;
    if (iVar3 == 3) {
      return 0x14;
    }
    if (iVar3 == 0) {
      local_44 = inflateNoCompression
                           (in_RSI,in_RDX,in_RCX,pos_00,CONCAT44(uVar4,in_stack_ffffffffffffffc8));
    }
    else {
      local_44 = inflateHuffmanBlock(in_stack_00000060,in_stack_00000058,in_stack_00000050,
                                     in_stack_00000048,in_stack_00000040,out._4_4_);
    }
  } while (local_44 == 0);
  return local_44;
}

Assistant:

static unsigned lodepng_inflatev(ucvector* out,
                                 const unsigned char* in, size_t insize,
                                 const LodePNGDecompressSettings* settings)
{
  /*bit pointer in the "in" data, current byte is bp >> 3, current bit is bp & 0x7 (from lsb to msb of the byte)*/
  size_t bp = 0;
  unsigned BFINAL = 0;
  size_t pos = 0; /*byte position in the out buffer*/
  unsigned error = 0;

  (void)settings;

  while(!BFINAL)
  {
    unsigned BTYPE;
    if(bp + 2 >= insize * 8) return 52; /*error, bit pointer will jump past memory*/
    BFINAL = readBitFromStream(&bp, in);
    BTYPE = 1u * readBitFromStream(&bp, in);
    BTYPE += 2u * readBitFromStream(&bp, in);

    if(BTYPE == 3) return 20; /*error: invalid BTYPE*/
    else if(BTYPE == 0) error = inflateNoCompression(out, in, &bp, &pos, insize); /*no compression*/
    else error = inflateHuffmanBlock(out, in, &bp, &pos, insize, BTYPE); /*compression, BTYPE 01 or 10*/

    if(error) return error;
  }

  return error;
}